

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct32_stage9_sse2(__m128i *output,__m128i *x)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  
  alVar2 = *x;
  alVar1 = x[0x1f];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  *output = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x1f] = alVar2;
  alVar2 = x[1];
  alVar1 = x[0x1e];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[1] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x1e] = alVar2;
  alVar2 = x[2];
  alVar1 = x[0x1d];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[2] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x1d] = alVar2;
  alVar2 = x[3];
  alVar1 = x[0x1c];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[3] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x1c] = alVar2;
  alVar2 = x[4];
  alVar1 = x[0x1b];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[4] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x1b] = alVar2;
  alVar2 = x[5];
  alVar1 = x[0x1a];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[5] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x1a] = alVar2;
  alVar2 = x[6];
  alVar1 = x[0x19];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[6] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x19] = alVar2;
  alVar2 = x[7];
  alVar1 = x[0x18];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[7] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x18] = alVar2;
  alVar2 = x[8];
  alVar1 = x[0x17];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[8] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x17] = alVar2;
  alVar2 = x[9];
  alVar1 = x[0x16];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[9] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x16] = alVar2;
  alVar2 = x[10];
  alVar1 = x[0x15];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[10] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x15] = alVar2;
  alVar2 = x[0xb];
  alVar1 = x[0x14];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0xb] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x14] = alVar2;
  alVar2 = x[0xc];
  alVar1 = x[0x13];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0xc] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x13] = alVar2;
  alVar2 = x[0xd];
  alVar1 = x[0x12];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0xd] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x12] = alVar2;
  alVar2 = x[0xe];
  alVar1 = x[0x11];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0xe] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x11] = alVar2;
  alVar2 = x[0xf];
  alVar1 = x[0x10];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0xf] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x10] = alVar2;
  return;
}

Assistant:

static inline void idct32_stage9_sse2(__m128i *output, __m128i *x) {
  btf_16_adds_subs_out_sse2(output[0], output[31], x[0], x[31]);
  btf_16_adds_subs_out_sse2(output[1], output[30], x[1], x[30]);
  btf_16_adds_subs_out_sse2(output[2], output[29], x[2], x[29]);
  btf_16_adds_subs_out_sse2(output[3], output[28], x[3], x[28]);
  btf_16_adds_subs_out_sse2(output[4], output[27], x[4], x[27]);
  btf_16_adds_subs_out_sse2(output[5], output[26], x[5], x[26]);
  btf_16_adds_subs_out_sse2(output[6], output[25], x[6], x[25]);
  btf_16_adds_subs_out_sse2(output[7], output[24], x[7], x[24]);
  btf_16_adds_subs_out_sse2(output[8], output[23], x[8], x[23]);
  btf_16_adds_subs_out_sse2(output[9], output[22], x[9], x[22]);
  btf_16_adds_subs_out_sse2(output[10], output[21], x[10], x[21]);
  btf_16_adds_subs_out_sse2(output[11], output[20], x[11], x[20]);
  btf_16_adds_subs_out_sse2(output[12], output[19], x[12], x[19]);
  btf_16_adds_subs_out_sse2(output[13], output[18], x[13], x[18]);
  btf_16_adds_subs_out_sse2(output[14], output[17], x[14], x[17]);
  btf_16_adds_subs_out_sse2(output[15], output[16], x[15], x[16]);
}